

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMask.cpp
# Opt level: O2

int __thiscall chrono::ChLinkMask::SetAllDisabled(ChLinkMask *this,bool mdis)

{
  ChConstraintTwoBodies *pCVar1;
  int iVar2;
  int i;
  int i_00;
  
  iVar2 = 0;
  for (i_00 = 0; i_00 < this->nconstr; i_00 = i_00 + 1) {
    pCVar1 = Constr_N(this,i_00);
    if ((pCVar1->super_ChConstraintTwo).super_ChConstraint.disabled != mdis) {
      pCVar1 = Constr_N(this,i_00);
      ChConstraint::SetDisabled((ChConstraint *)pCVar1,mdis);
      iVar2 = iVar2 + 1;
    }
  }
  return iVar2;
}

Assistant:

int ChLinkMask::SetAllDisabled(bool mdis) {
    int cnt = 0;

    for (int i = 0; i < nconstr; i++) {
        if (Constr_N(i).IsDisabled() != mdis) {
            Constr_N(i).SetDisabled(mdis);
            cnt++;
        }
    }

    return cnt;
}